

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::EqualTest<int,int>(void)

{
  bool bVar1;
  bool local_31;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffd0;
  undefined1 lhs;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffd4;
  int local_28;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_24;
  int local_20;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_1c;
  int local_18;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_14;
  int local_10;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_c;
  int local_8;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_4;
  
  local_8 = 3;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_4,&local_8);
  bVar1 = ::operator==(in_stack_ffffffffffffffd0.m_int,in_stack_ffffffffffffffd4);
  local_31 = false;
  if (bVar1) {
    local_10 = 4;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_c,&local_10);
    bVar1 = ::operator==(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0.m_int);
    local_31 = false;
    if (bVar1) {
      local_18 = 6;
      SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
                (&local_14,&local_18);
      local_20 = 7;
      SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
                (&local_1c,&local_20);
      bVar1 = ::operator==(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      lhs = (undefined1)((uint)in_stack_ffffffffffffffd0.m_int >> 0x18);
      local_31 = false;
      if (bVar1) {
        local_28 = 1;
        SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
        SafeInt(&local_24,&local_28);
        bVar1 = ::operator==((bool)lhs,in_stack_ffffffffffffffd4);
        local_31 = false;
        if (bVar1) {
          bVar1 = false;
          SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
          SafeInt((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *)&stack0xffffffffffffffd4,(int *)&stack0xffffffffffffffd0);
          local_31 = ::operator==(bVar1,in_stack_ffffffffffffffd4);
        }
      }
    }
  }
  return local_31;
}

Assistant:

SAFEINT_CONSTEXPR11 bool EqualTest()
	{
		return
			(U)2 == SafeInt<T>(3) &&
			SafeInt<T>(4) == (U)5 &&
			SafeInt<T>(6) == SafeInt<U>(7) &&
			true == SafeInt<T>(1) &&
			false == SafeInt<T>(0);
	}